

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_zstd.c
# Opt level: O3

int archive_compressor_zstd_close(archive_write_filter *f)

{
  int iVar1;
  int iVar2;
  
  iVar1 = drive_compressor(f,(private_data_conflict8 *)f->data,1,(void *)0x0,0);
  iVar2 = __archive_write_close_filter(f->next_filter);
  if (iVar1 < iVar2) {
    iVar2 = iVar1;
  }
  return iVar2;
}

Assistant:

static int
archive_compressor_zstd_close(struct archive_write_filter *f)
{
	struct private_data *data = (struct private_data *)f->data;
	int r1, r2;

	/* Finish zstd frame */
	r1 = drive_compressor(f, data, 1, NULL, 0);

	r2 = __archive_write_close_filter(f->next_filter);

	return r1 < r2 ? r1 : r2;
}